

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O3

void __thiscall chrono::ChConstraintTwoBodies::ChConstraintTwoBodies(ChConstraintTwoBodies *this)

{
  undefined1 auVar1 [64];
  
  (this->super_ChConstraintTwo).super_ChConstraint.valid = false;
  (this->super_ChConstraintTwo).super_ChConstraint.disabled = false;
  (this->super_ChConstraintTwo).super_ChConstraint.redundant = false;
  (this->super_ChConstraintTwo).super_ChConstraint.broken = false;
  (this->super_ChConstraintTwo).super_ChConstraint.c_i = 0.0;
  (this->super_ChConstraintTwo).super_ChConstraint.l_i = 0.0;
  (this->super_ChConstraintTwo).super_ChConstraint.b_i = 0.0;
  (this->super_ChConstraintTwo).super_ChConstraint.cfm_i = 0.0;
  (this->super_ChConstraintTwo).super_ChConstraint.active = true;
  (this->super_ChConstraintTwo).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->super_ChConstraintTwo).super_ChConstraint.g_i = 0.0;
  (this->super_ChConstraintTwo).variables_a = (ChVariables *)SUB168(ZEXT416(0) << 0x40,0);
  (this->super_ChConstraintTwo).variables_b = (ChVariables *)SUB168(ZEXT416(0) << 0x40,8);
  auVar1 = ZEXT464(0) << 0x40;
  (this->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraint_00b3b0b0;
  this->Cq_a = (ChRowVectorN<double,_6>)auVar1._0_48_;
  (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [0] = (double)auVar1._48_8_;
  (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
  [1] = (double)auVar1._56_8_;
  *(undefined1 (*) [64])
   ((this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array
   + 2) = auVar1;
  *(undefined1 (*) [64])
   ((this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
   + 4) = auVar1;
  return;
}

Assistant:

ChConstraintTwoBodies::ChConstraintTwoBodies() {
    Cq_a.setZero();
    Cq_b.setZero();
    Eq_a.setZero();
    Eq_b.setZero();
}